

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

unsigned_long ndiGetTXFrame(ndicapi *pol,int ph)

{
  char cVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = pol->TxHandleCount;
  if ((long)iVar5 < 1) {
    uVar3 = 0;
LAB_001098a2:
    if ((int)uVar3 == iVar5) {
      return 0;
    }
    lVar4 = 0;
    uVar2 = 0;
    do {
      cVar1 = pol->TxFrame[uVar3 & 0xffffffff][lVar4];
      iVar5 = -0x57;
      if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
        return uVar2;
      }
      uVar2 = uVar2 << 4 | (ulong)(uint)(iVar5 + cVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    do {
      if ((uint)pol->TxHandles[uVar3] == ph) goto LAB_001098a2;
      uVar3 = uVar3 + 1;
    } while ((long)iVar5 != uVar3);
  }
  return uVar2;
}

Assistant:

ndicapiExport unsigned long ndiGetTXFrame(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxFrame[i];

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}